

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

ZSTD_DStream * ZSTD_initStaticDStream(void *workspace,size_t workspaceSize)

{
  if (workspaceSize < 0x271f8 || ((ulong)workspace & 7) != 0) {
    workspace = (ZSTD_DStream *)0x0;
  }
  else {
    ZSTD_initDCtx_internal((ZSTD_DCtx *)workspace);
    *(size_t *)((long)workspace + 29000) = workspaceSize;
    *(long *)((long)workspace + 0x7178) = (long)workspace + 0x271f8;
  }
  return (ZSTD_DStream *)workspace;
}

Assistant:

ZSTD_DStream* ZSTD_initStaticDStream(void *workspace, size_t workspaceSize)
{
    return ZSTD_initStaticDCtx(workspace, workspaceSize);
}